

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O1

void __thiscall
HenyeyGreenstein_SamplingOrientationForward_Test::~HenyeyGreenstein_SamplingOrientationForward_Test
          (HenyeyGreenstein_SamplingOrientationForward_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HenyeyGreenstein, SamplingOrientationForward) {
    HGPhaseFunction hg(0.95);
    Vector3f wo(-1, 0, 0);
    int nForward = 0, nBackward = 0;
    for (Point2f u : Uniform2D(100)) {
        auto ps = hg.Sample_p(wo, u);
        EXPECT_TRUE(ps.has_value());
        if (ps->wi.x > 0)
            ++nForward;
        else
            ++nBackward;
    }
    // With g = 0.95, almost all of the samples should have wi.x > 0.
    EXPECT_GE(nForward, 10 * nBackward);
}